

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O2

void __thiscall
Imath_2_5::Box<Imath_2_5::Vec3<int>_>::extendBy(Box<Imath_2_5::Vec3<int>_> *this,Vec3<int> *point)

{
  int iVar1;
  
  iVar1 = point->x;
  if (iVar1 < (this->min).x) {
    (this->min).x = iVar1;
    iVar1 = point->x;
  }
  if ((this->max).x < iVar1) {
    (this->max).x = iVar1;
  }
  iVar1 = point->y;
  if (iVar1 < (this->min).y) {
    (this->min).y = iVar1;
    iVar1 = point->y;
  }
  if ((this->max).y < iVar1) {
    (this->max).y = iVar1;
  }
  iVar1 = point->z;
  if (iVar1 < (this->min).z) {
    (this->min).z = iVar1;
    iVar1 = point->z;
  }
  if ((this->max).z < iVar1) {
    (this->max).z = iVar1;
  }
  return;
}

Assistant:

inline void
Box<Vec3<T> >::extendBy (const Vec3<T> &point)
{
    if (point[0] < min[0])
        min[0] = point[0];

    if (point[0] > max[0])
        max[0] = point[0];

    if (point[1] < min[1])
        min[1] = point[1];

    if (point[1] > max[1])
        max[1] = point[1];

    if (point[2] < min[2])
        min[2] = point[2];

    if (point[2] > max[2])
        max[2] = point[2];
}